

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O2

jint Java_beagle_BeagleJNIWrapper_getTipStates
               (JNIEnv *env,jobject obj,jint instance,jint tipIndex,jintArray outTipStates)

{
  fwrite("beagleGetTipStates is not yet implemented\n",0x2a,1,_stderr);
  exit(0);
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_getTipStates
(JNIEnv *env, jobject obj, jint instance, jint tipIndex, jintArray outTipStates)
{
	fprintf(stderr,"beagleGetTipStates is not yet implemented\n");
    exit(0);

//    jint *tipStates = env->GetIntArrayElements(outTipStates, NULL);
//
//	jint errCode = (jint)beagleGetTipStates(instance, tipIndex, (int *)tipStates);
//
//    env->ReleaseIntArrayElements(outTipStates, tipStates, 0);
//    return errCode;
}